

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

RecGroup __thiscall wasm::anon_unknown_0::RecGroupStore::insert(RecGroupStore *this,RecGroup group)

{
  type *this_00;
  type_conflict *ptVar1;
  pointer pRVar2;
  pair<std::__detail::_Node_iterator<wasm::(anonymous_namespace)::RecGroupStructure,_true,_true>,_bool>
  pVar3;
  type_conflict *inserted;
  type *it;
  pair<std::__detail::_Node_iterator<wasm::(anonymous_namespace)::RecGroupStructure,_true,_true>,_bool>
  local_38;
  value_type local_28;
  RecGroupStructure structure;
  RecGroupStore *this_local;
  RecGroup group_local;
  
  local_28.group.id = (RecGroup)(RecGroup)group.id;
  structure.group.id = (RecGroup)(RecGroup)this;
  pVar3 = std::
          unordered_set<wasm::(anonymous_namespace)::RecGroupStructure,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>_>
          ::insert(&this->canonicalGroups,&local_28);
  local_38.first =
       pVar3.first.super__Node_iterator_base<wasm::(anonymous_namespace)::RecGroupStructure,_true>.
       _M_cur;
  local_38.second = pVar3.second;
  this_00 = std::
            get<0ul,std::__detail::_Node_iterator<wasm::(anonymous_namespace)::RecGroupStructure,true,true>,bool>
                      (&local_38);
  ptVar1 = std::
           get<1ul,std::__detail::_Node_iterator<wasm::(anonymous_namespace)::RecGroupStructure,true,true>,bool>
                     (&local_38);
  group_local.id = group.id;
  if ((*ptVar1 & 1U) == 0) {
    pRVar2 = std::__detail::
             _Node_iterator<wasm::(anonymous_namespace)::RecGroupStructure,_true,_true>::operator->
                       (this_00);
    group_local.id = (pRVar2->group).id;
  }
  return (RecGroup)group_local.id;
}

Assistant:

RecGroup insert(RecGroup group) {
    RecGroupStructure structure{group};
    auto [it, inserted] = canonicalGroups.insert(structure);
    if (inserted) {
      return group;
    } else {
      return it->group;
    }
  }